

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

bool __thiscall polyscope::render::Engine::transparencyEnabled(Engine *this)

{
  TransparencyMode TVar1;
  Engine *this_local;
  bool local_1;
  
  TVar1 = this->transparencyMode;
  if (TVar1 == None) {
    local_1 = false;
  }
  else if (TVar1 == Simple) {
    local_1 = true;
  }
  else if (TVar1 == Pretty) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Engine::transparencyEnabled() {
  switch (transparencyMode) {
  case TransparencyMode::None:
    return false;
  case TransparencyMode::Simple:
    return true;
  case TransparencyMode::Pretty:
    return true;
  }
  return false;
}